

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

void Gem_FuncExpand(Gem_Man_t *p,int f,int i)

{
  word *pOut;
  word *pOut_00;
  word *pOut_01;
  int iVar1;
  int iVar2;
  Gem_Obj_t *pGVar3;
  Gem_Obj_t *pGVar4;
  word *pIn;
  char local_68 [8];
  char pCanonPermC [16];
  int local_4c;
  int iFunc;
  int v;
  word *pCofs [2];
  word *pResult;
  word *pTruth;
  Gem_Obj_t *pObj;
  Gem_Obj_t *pNew;
  int i_local;
  int f_local;
  Gem_Man_t *p_local;
  
  pGVar3 = p->pObjs + p->nObjs;
  pGVar4 = p->pObjs + f;
  pIn = Vec_MemReadEntry(p->vTtMem,f);
  pOut = p->pTtElems[p->nVars];
  pOut_00 = p->pTtElems[p->nVars + 2];
  pOut_01 = p->pTtElems[p->nVars + 3];
  if ((int)(*(uint *)pGVar4 & 0xf) <= i) {
    __assert_fail("i < (int)pObj->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xde,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  if (p->nVars < (int)((*(uint *)pGVar4 & 0xf) + 2)) {
    __assert_fail("(int)pObj->nVars + 2 <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xdf,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  Abc_TtCopy(pOut,pIn,p->nWords,0);
  for (local_4c = i; local_4c < (int)((*(uint *)pGVar4 & 0xf) - 1); local_4c = local_4c + 1) {
    Abc_TtSwapAdjacent(pOut,p->nWords,local_4c);
  }
  if (local_4c != (*(uint *)pGVar4 & 0xf) - 1) {
    __assert_fail("v == (int)pObj->nVars-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xe5,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  Abc_TtCofactor0p(pOut_00,pOut,p->nWords,local_4c);
  Abc_TtCofactor1p(pOut_01,pOut,p->nWords,local_4c);
  Abc_TtMaj(pOut,p->pTtElems[local_4c],p->pTtElems[local_4c + 1],p->pTtElems[local_4c + 2],p->nWords
           );
  Abc_TtMux(pOut,pOut,pOut_01,pOut_00,p->nWords);
  Abc_TtCanonicizePerm(pOut,(*(uint *)pGVar4 & 0xf) + 2,local_68);
  iVar1 = Abc_MaxInt(6,(*(uint *)pGVar4 & 0xf) + 2);
  Abc_TtStretch6(pOut,iVar1,p->nVars);
  iVar1 = Vec_MemHashInsert(p->vTtMem,pOut);
  if (p->nObjs <= iVar1) {
    if (iVar1 != p->nObjs) {
      __assert_fail("iFunc == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xf2,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    *(uint *)pGVar3 = *(uint *)pGVar3 & 0xfffffff0 | (*(uint *)pGVar4 & 0xf) + 2 & 0xf;
    *(uint *)pGVar3 = *(uint *)pGVar3 & 0xffffff0f | ((*(uint *)pGVar4 >> 4 & 0xf) + 1 & 0xf) << 4;
    iVar2 = Gem_GroupsDerive(pOut,*(uint *)pGVar3 & 0xf,pOut_00,pOut_01);
    *(uint *)pGVar3 = *(uint *)pGVar3 & 0xffff | iVar2 << 0x10;
    pGVar3->Predec = f;
    *(uint *)pGVar3 = *(uint *)pGVar3 & 0xffff00ff | (i & 0xffU) << 8;
    Gem_PrintNode(p,iVar1,"Expand  ",0);
    if (p->nObjsAlloc <= p->nObjs) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xfa,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    iVar1 = p->nObjs + 1;
    p->nObjs = iVar1;
    if (iVar1 == p->nObjsAlloc) {
      Gem_ManRealloc(p);
    }
  }
  return;
}

Assistant:

void Gem_FuncExpand( Gem_Man_t * p, int f, int i )
{
    Gem_Obj_t * pNew = p->pObjs + p->nObjs, * pObj = p->pObjs + f; 
    word * pTruth   = Vec_MemReadEntry( p->vTtMem, f );
    word * pResult  = p->pTtElems[p->nVars];
    word * pCofs[2] = { p->pTtElems[p->nVars+2], p->pTtElems[p->nVars+3] };
    int v, iFunc;
    char pCanonPermC[16];
    assert( i < (int)pObj->nVars );
    assert( (int)pObj->nVars + 2 <= p->nVars );
    Abc_TtCopy( pResult, pTruth, p->nWords, 0 );
    // move i variable to the end
    for ( v = i; v < (int)pObj->nVars-1; v++ )
        Abc_TtSwapAdjacent( pResult, p->nWords, v );
    // create new symmetric group
    assert( v == (int)pObj->nVars-1 );
    Abc_TtCofactor0p( pCofs[0], pResult, p->nWords, v );
    Abc_TtCofactor1p( pCofs[1], pResult, p->nWords, v );
    Abc_TtMaj( pResult, p->pTtElems[v], p->pTtElems[v+1], p->pTtElems[v+2], p->nWords );
    Abc_TtMux( pResult, pResult, pCofs[1], pCofs[0], p->nWords );
    // canonicize
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n");
    Abc_TtCanonicizePerm( pResult, pObj->nVars + 2, pCanonPermC );
    Abc_TtStretch6( pResult, Abc_MaxInt(6, pObj->nVars+2), p->nVars );
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n\n");
    iFunc = Vec_MemHashInsert( p->vTtMem, pResult );
    if ( iFunc < p->nObjs )
        return;
    assert( iFunc == p->nObjs );
    pNew->nVars   = pObj->nVars + 2;
    pNew->nNodes  = pObj->nNodes + 1;
    pNew->Groups  = Gem_GroupsDerive( pResult, pNew->nVars, pCofs[0], pCofs[1] );
    pNew->Predec  = f;
    pNew->History = i; 
    Gem_PrintNode( p, iFunc, "Expand  ", 0 );

    assert( p->nObjs < p->nObjsAlloc );
    if ( ++p->nObjs == p->nObjsAlloc )
        Gem_ManRealloc( p );
}